

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

string * minja::html_escape(string *s)

{
  bool bVar1;
  reference pcVar2;
  undefined8 in_RSI;
  string *in_RDI;
  char *c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *result;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  undefined1 local_11;
  undefined8 local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_30 = local_10;
  local_38._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), bVar1)
  {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_38);
    in_stack_ffffffffffffffa0 =
         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(ulong)((int)*pcVar2 - 0x22);
    switch(in_stack_ffffffffffffffa0) {
    case (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x0:
      std::__cxx11::string::operator+=((string *)in_RDI,"&#34;");
      break;
    default:
      std::__cxx11::string::operator+=((string *)in_RDI,*pcVar2);
      break;
    case (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x4:
      std::__cxx11::string::operator+=((string *)in_RDI,"&amp;");
      break;
    case (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x5:
      std::__cxx11::string::operator+=((string *)in_RDI,"&apos;");
      break;
    case (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x1a:
      std::__cxx11::string::operator+=((string *)in_RDI,"&lt;");
      break;
    case (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x1c:
      std::__cxx11::string::operator+=((string *)in_RDI,"&gt;");
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_38);
  }
  return in_RDI;
}

Assistant:

static std::string html_escape(const std::string & s) {
  std::string result;
  result.reserve(s.size());
  for (const auto & c : s) {
    switch (c) {
      case '&': result += "&amp;"; break;
      case '<': result += "&lt;"; break;
      case '>': result += "&gt;"; break;
      case '"': result += "&#34;"; break;
      case '\'': result += "&apos;"; break;
      default: result += c; break;
    }
  }
  return result;
}